

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::BasicTexImageCubeCase::createTexture(BasicTexImageCubeCase *this)

{
  deUint32 format;
  deUint32 type;
  float height;
  int iVar1;
  int y;
  deUint32 dVar2;
  char *str;
  void *data;
  int local_13c;
  PixelBufferAccess local_130;
  PixelBufferAccess local_108;
  Vector<float,_4> local_dc;
  Vector<float,_4> local_cc;
  undefined1 local_bc [8];
  Vec4 gMax;
  Vector<float,_4> local_9c;
  undefined1 local_8c [8];
  Vec4 gMin;
  int face;
  int levelH;
  int levelW;
  int ndx;
  undefined1 local_60 [8];
  Random rnd;
  TextureLevel levelData;
  deUint32 tex;
  int numLevels;
  TextureFormat fmt;
  BasicTexImageCubeCase *this_local;
  
  _tex = (this->super_TextureSpecCase).m_texFormat;
  fmt = (TextureFormat)this;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_13c = 1;
  }
  else {
    iVar1 = ::deLog2Floor32((this->super_TextureSpecCase).m_width);
    y = ::deLog2Floor32((this->super_TextureSpecCase).m_height);
    local_13c = de::max<int>(iVar1,y);
    local_13c = local_13c + 1;
  }
  levelData.m_data.m_cap._4_4_ = local_13c;
  levelData.m_data.m_cap._0_4_ = 0;
  tcu::TextureLevel::TextureLevel((TextureLevel *)&rnd.m_rnd.z,(TextureFormat *)&tex);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)local_60,dVar2);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureSpecCase).super_ContextWrapper,1,
             (deUint32 *)&levelData.m_data.m_cap);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureSpecCase).super_ContextWrapper,0x8513,
             (deUint32)levelData.m_data.m_cap);
  sglr::ContextWrapper::glPixelStorei(&(this->super_TextureSpecCase).super_ContextWrapper,0xcf5,1);
  for (levelH = 0; levelH < levelData.m_data.m_cap._4_4_; levelH = levelH + 1) {
    iVar1 = de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH & 0x1f));
    gMin.m_data[3] =
         (float)de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH & 0x1f));
    tcu::TextureLevel::setSize((TextureLevel *)&rnd.m_rnd.z,iVar1,(int)gMin.m_data[3],1);
    for (gMin.m_data[2] = 0.0; (int)gMin.m_data[2] < 6;
        gMin.m_data[2] = (float)((int)gMin.m_data[2] + 1)) {
      tcu::Vector<float,_4>::Vector(&local_9c,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),1.0);
      randomVector<4>((Functional *)local_8c,(Random *)local_60,&local_9c,
                      (Vector<float,_4> *)(gMax.m_data + 2));
      tcu::Vector<float,_4>::Vector(&local_cc,0.0);
      tcu::Vector<float,_4>::Vector(&local_dc,1.0);
      randomVector<4>((Functional *)local_bc,(Random *)local_60,&local_cc,&local_dc);
      tcu::TextureLevel::getAccess(&local_108,(TextureLevel *)&rnd.m_rnd.z);
      tcu::fillWithComponentGradients(&local_108,(Vec4 *)local_8c,(Vec4 *)local_bc);
      height = gMin.m_data[3];
      dVar2 = *(deUint32 *)(s_cubeMapFaces + (long)(int)gMin.m_data[2] * 4);
      format = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_130,(TextureLevel *)&rnd.m_rnd.z);
      data = tcu::PixelBufferAccess::getDataPtr(&local_130);
      sglr::ContextWrapper::glTexImage2D
                (&(this->super_TextureSpecCase).super_ContextWrapper,dVar2,levelH,format,iVar1,
                 (int)height,0,format,type,data);
    }
  }
  de::Random::~Random((Random *)local_60);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&rnd.m_rnd.z);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(fmt);
		de::Random			rnd			(deStringHash(getName()));

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			levelData.setSize(levelW, levelH);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd);
				Vec4 gMax = randomVector<4>(rnd);

				tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
			}
		}
	}